

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O1

FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *
Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::add
          (FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
           *__return_storage_ptr__,AbstractingUnifier *au,
          FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
          *s1,FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *s2)

{
  int *piVar1;
  _Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false> _Var2;
  _Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false> _Var3;
  Entry *pEVar4;
  anon_class_1_0_00000001 mergeArray;
  VirtualIterator<Kernel::VarSpec> local_40;
  undefined1 local_31;
  
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::
  add(Kernel::AbstractingUnifier&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>)
  ::{lambda(auto:1&,auto:2&)#1}::operator()
            (&local_31,
             (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
             (s1->ratVars)._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ,(Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
              (s2->ratVars)._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
              .
              super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
            );
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::
  add(Kernel::AbstractingUnifier&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>)
  ::{lambda(auto:1&,auto:2&)#1}::operator()
            (&local_31,
             (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
             (s1->intVars)._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ._M_head_impl,
             (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
             (s2->intVars)._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ._M_head_impl);
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::
  add(Kernel::AbstractingUnifier&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>)
  ::{lambda(auto:1&,auto:2&)#1}::operator()
            (&local_31,
             (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
             (s1->mixVars)._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ._M_head_impl,
             (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
             (s2->mixVars)._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ._M_head_impl);
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::
  add(Kernel::AbstractingUnifier&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>)
  ::{lambda(auto:1&,auto:2&)#1}::operator()
            (&local_31,
             (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
             (s1->ratAtoms)._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ._M_head_impl,
             (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
             (s2->ratAtoms)._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ._M_head_impl);
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::
  add(Kernel::AbstractingUnifier&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>)
  ::{lambda(auto:1&,auto:2&)#1}::operator()
            (&local_31,
             (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
             (s1->intAtoms)._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ._M_head_impl,
             (Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *)
             (s2->intAtoms)._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ._M_head_impl);
  _Var2._M_head_impl =
       (s1->ratVarSet)._self._M_t.
       super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       .
       super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
       ._M_head_impl;
  _Var3._M_head_impl =
       (s2->ratVarSet)._self._M_t.
       super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       .
       super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
       ._M_head_impl;
  local_40._core = (IteratorCore<Kernel::VarSpec> *)::operator_new(0x28);
  (local_40._core)->_refCnt = 0;
  (local_40._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b69dc0;
  pEVar4 = ((_Var3._M_head_impl)->_map)._afterLast;
  local_40._core[1]._vptr_IteratorCore = (_func_int **)((_Var3._M_head_impl)->_map)._entries;
  *(Entry **)&local_40._core[1]._refCnt = pEVar4;
  *(undefined4 *)&local_40._core[2]._vptr_IteratorCore = ((_Var3._M_head_impl)->_map)._timestamp;
  (local_40._core)->_refCnt = 1;
  ::Lib::DHSet<Kernel::VarSpec,Lib::DefaultHash,Lib::DefaultHash2>::
  loadFromIterator<Lib::VirtualIterator<Kernel::VarSpec>>
            ((DHSet<Kernel::VarSpec,Lib::DefaultHash,Lib::DefaultHash2> *)_Var2._M_head_impl,
             &local_40);
  if (local_40._core != (IteratorCore<Kernel::VarSpec> *)0x0) {
    piVar1 = &(local_40._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_40._core)->_vptr_IteratorCore[1])();
    }
  }
  _Var2._M_head_impl =
       (s1->mixVarSet)._self._M_t.
       super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       .
       super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
       ._M_head_impl;
  _Var3._M_head_impl =
       (s2->mixVarSet)._self._M_t.
       super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       .
       super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
       ._M_head_impl;
  local_40._core = (IteratorCore<Kernel::VarSpec> *)::operator_new(0x28);
  (local_40._core)->_refCnt = 0;
  (local_40._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b69dc0;
  pEVar4 = ((_Var3._M_head_impl)->_map)._afterLast;
  local_40._core[1]._vptr_IteratorCore = (_func_int **)((_Var3._M_head_impl)->_map)._entries;
  *(Entry **)&local_40._core[1]._refCnt = pEVar4;
  *(undefined4 *)&local_40._core[2]._vptr_IteratorCore = ((_Var3._M_head_impl)->_map)._timestamp;
  (local_40._core)->_refCnt = 1;
  ::Lib::DHSet<Kernel::VarSpec,Lib::DefaultHash,Lib::DefaultHash2>::
  loadFromIterator<Lib::VirtualIterator<Kernel::VarSpec>>
            ((DHSet<Kernel::VarSpec,Lib::DefaultHash,Lib::DefaultHash2> *)_Var2._M_head_impl,
             &local_40);
  if (local_40._core != (IteratorCore<Kernel::VarSpec> *)0x0) {
    piVar1 = &(local_40._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_40._core)->_vptr_IteratorCore[1])();
    }
  }
  _Var2._M_head_impl =
       (s1->intVarSet)._self._M_t.
       super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       .
       super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
       ._M_head_impl;
  _Var3._M_head_impl =
       (s2->intVarSet)._self._M_t.
       super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       .
       super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
       ._M_head_impl;
  local_40._core = (IteratorCore<Kernel::VarSpec> *)::operator_new(0x28);
  (local_40._core)->_refCnt = 0;
  (local_40._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b69dc0;
  pEVar4 = ((_Var3._M_head_impl)->_map)._afterLast;
  local_40._core[1]._vptr_IteratorCore = (_func_int **)((_Var3._M_head_impl)->_map)._entries;
  *(Entry **)&local_40._core[1]._refCnt = pEVar4;
  *(undefined4 *)&local_40._core[2]._vptr_IteratorCore = ((_Var3._M_head_impl)->_map)._timestamp;
  (local_40._core)->_refCnt = 1;
  ::Lib::DHSet<Kernel::VarSpec,Lib::DefaultHash,Lib::DefaultHash2>::
  loadFromIterator<Lib::VirtualIterator<Kernel::VarSpec>>
            ((DHSet<Kernel::VarSpec,Lib::DefaultHash,Lib::DefaultHash2> *)_Var2._M_head_impl,
             &local_40);
  if (local_40._core != (IteratorCore<Kernel::VarSpec> *)0x0) {
    piVar1 = &(local_40._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_40._core)->_vptr_IteratorCore[1])();
    }
  }
  _Var2._M_head_impl =
       (s1->shieldedVars)._self._M_t.
       super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       .
       super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
       ._M_head_impl;
  _Var3._M_head_impl =
       (s2->shieldedVars)._self._M_t.
       super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
       .
       super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
       ._M_head_impl;
  local_40._core = (IteratorCore<Kernel::VarSpec> *)::operator_new(0x28);
  (local_40._core)->_refCnt = 0;
  (local_40._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b69dc0;
  pEVar4 = ((_Var3._M_head_impl)->_map)._afterLast;
  local_40._core[1]._vptr_IteratorCore = (_func_int **)((_Var3._M_head_impl)->_map)._entries;
  *(Entry **)&local_40._core[1]._refCnt = pEVar4;
  *(undefined4 *)&local_40._core[2]._vptr_IteratorCore = ((_Var3._M_head_impl)->_map)._timestamp;
  (local_40._core)->_refCnt = 1;
  ::Lib::DHSet<Kernel::VarSpec,Lib::DefaultHash,Lib::DefaultHash2>::
  loadFromIterator<Lib::VirtualIterator<Kernel::VarSpec>>
            ((DHSet<Kernel::VarSpec,Lib::DefaultHash,Lib::DefaultHash2> *)_Var2._M_head_impl,
             &local_40);
  if (local_40._core != (IteratorCore<Kernel::VarSpec> *)0x0) {
    piVar1 = &(local_40._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_40._core)->_vptr_IteratorCore[1])();
    }
  }
  (__return_storage_ptr__->ratVars)._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
       = (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
         (s1->ratVars)._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         .
         super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
  ;
  (s1->ratVars)._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
       = (_Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
          )0x0;
  (__return_storage_ptr__->intVars)._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
  ._M_head_impl =
       (s1->intVars)._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       .
       super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
       ._M_head_impl;
  (s1->intVars)._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
  ._M_head_impl = (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)0x0;
  (__return_storage_ptr__->mixVars)._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
  ._M_head_impl =
       (s1->mixVars)._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       .
       super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
       ._M_head_impl;
  (s1->mixVars)._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
  ._M_head_impl = (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)0x0;
  (__return_storage_ptr__->ratAtoms)._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
  ._M_head_impl =
       (s1->ratAtoms)._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       .
       super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
       ._M_head_impl;
  (s1->ratAtoms)._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
  ._M_head_impl = (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)0x0;
  (__return_storage_ptr__->intAtoms)._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
  ._M_head_impl =
       (s1->intAtoms)._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       .
       super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
       ._M_head_impl;
  (s1->intAtoms)._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
  ._M_head_impl = (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)0x0;
  (__return_storage_ptr__->ratVarSet)._self._M_t.
  super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  .super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>.
  _M_head_impl = (s1->ratVarSet)._self._M_t.
                 super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                 .
                 super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                 ._M_head_impl;
  (s1->ratVarSet)._self._M_t.
  super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  .super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>.
  _M_head_impl = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0;
  (__return_storage_ptr__->mixVarSet)._self._M_t.
  super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  .super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>.
  _M_head_impl = (s1->mixVarSet)._self._M_t.
                 super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                 .
                 super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                 ._M_head_impl;
  (s1->mixVarSet)._self._M_t.
  super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  .super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>.
  _M_head_impl = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0;
  (__return_storage_ptr__->intVarSet)._self._M_t.
  super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  .super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>.
  _M_head_impl = (s1->intVarSet)._self._M_t.
                 super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                 .
                 super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                 ._M_head_impl;
  (s1->intVarSet)._self._M_t.
  super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  .super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>.
  _M_head_impl = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0;
  (__return_storage_ptr__->shieldedVars)._self._M_t.
  super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  .super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>.
  _M_head_impl = (s1->shieldedVars)._self._M_t.
                 super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                 .
                 super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                 ._M_head_impl;
  (s1->shieldedVars)._self._M_t.
  super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  .super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>.
  _M_head_impl = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0;
  return __return_storage_ptr__;
}

Assistant:

static FloorUwaState add(AbstractingUnifier& au, FloorUwaState s1, FloorUwaState s2) {
    auto mergeArray = [](auto& l, auto& r) {
      auto compare = [](auto& l, auto& r) { return TermSpec::compare(l.first, r.first,
          [](auto& t) -> auto& { return t; }); };
      //  ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^
      // TODO create option for "deep" compare using a differnt deref clsoure
      l.sort([&](auto& l, auto& r) { return compare(l, r) < 0; });
      r.sort([&](auto& l, auto& r) { return compare(l, r) < 0; });
      size_t li = 0;
      size_t ri = 0;
      size_t lEnd = l.size();
      size_t rEnd = r.size();
      while (li < lEnd && ri < rEnd) {
        auto cmp = compare(l[li], r[ri]);
        if (cmp == 0) {
          l[li].second += r[ri].second;
          ri++;
        } else if (cmp > 0) {
          l.push(r[ri++]);
        } else {
          li++;
        }
      }
      if (li == lEnd) {
        while (ri < rEnd) {
          l.push(r[ri++]);
        }
      }
      size_t read = 0;
      size_t write = 0;
      while (read < l.size()) {
        if (l[read].second == 0) {
          read++;
        } else {
          l[write++] = l[read++];
        }
      }
      l.pop(l.size() - write);
    };
    mergeArray(*s1.ratVars, *s2.ratVars);
    mergeArray(*s1.intVars, *s2.intVars);
    mergeArray(*s1.mixVars, *s2.mixVars);
    mergeArray(*s1.ratAtoms, *s2.ratAtoms);
    mergeArray(*s1.intAtoms, *s2.intAtoms);
    auto mergeSet = [](auto& l, auto& r) { l.loadFromIterator(r.iterator()); };
    mergeSet(*s1.ratVarSet, *s2.ratVarSet);
    mergeSet(*s1.mixVarSet, *s2.mixVarSet);
    mergeSet(*s1.intVarSet, *s2.intVarSet);
    mergeSet(*s1.shieldedVars, *s2.shieldedVars);
    return s1;
  }